

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cc
# Opt level: O1

void __thiscall xLearn::Reader::shrink_block(Reader *this,char *block,size_t *ret,FILE *file)

{
  size_t sVar1;
  long lVar2;
  long __off;
  
  sVar1 = *ret;
  lVar2 = 0;
  do {
    __off = lVar2;
    lVar2 = __off + -1;
  } while (block[__off + (sVar1 - 1)] != '\n');
  fseek((FILE *)file,__off,1);
  *ret = sVar1 + 1 + __off + -1;
  return;
}

Assistant:

void Reader::shrink_block(char* block, size_t* ret, FILE* file) {
  // Find the last '\n'
  size_t index = *ret-1;
  while (block[index] != '\n') { index--; }
  // Shrink back file pointer
  fseek(file, index-*ret+1, SEEK_CUR);
  // The real size of block
  *ret = index + 1;
}